

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polyline_vector_layer.cc
# Opt level: O1

void __thiscall
s2builderutil::S2PolylineVectorLayer::Init
          (S2PolylineVectorLayer *this,
          vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
          *polylines,LabelSetIds *label_set_ids,IdSetLexicon *label_set_lexicon,Options *options)

{
  PolylineType PVar1;
  DuplicateEdges DVar2;
  SiblingPairs SVar3;
  S2Debug SVar4;
  S2LogMessage SStack_18;
  
  if ((label_set_ids == (LabelSetIds *)0x0) == (label_set_lexicon == (IdSetLexicon *)0x0)) {
    this->polylines_ = polylines;
    this->label_set_ids_ = label_set_ids;
    this->label_set_lexicon_ = label_set_lexicon;
    PVar1 = options->polyline_type_;
    DVar2 = options->duplicate_edges_;
    SVar3 = options->sibling_pairs_;
    (this->options_).edge_type_ = options->edge_type_;
    (this->options_).polyline_type_ = PVar1;
    (this->options_).duplicate_edges_ = DVar2;
    (this->options_).sibling_pairs_ = SVar3;
    SVar4 = options->s2debug_override_;
    (this->options_).validate_ = options->validate_;
    (this->options_).s2debug_override_ = SVar4;
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_s2polyline_vector_layer.cc"
             ,0x36,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,
             "Check failed: (label_set_ids == nullptr) == (label_set_lexicon == nullptr) ",0x4b);
  abort();
}

Assistant:

void S2PolylineVectorLayer::Init(vector<unique_ptr<S2Polyline>>* polylines,
                                 LabelSetIds* label_set_ids,
                                 IdSetLexicon* label_set_lexicon,
                                 const Options& options) {
  S2_DCHECK_EQ(label_set_ids == nullptr, label_set_lexicon == nullptr);
  polylines_ = polylines;
  label_set_ids_ = label_set_ids;
  label_set_lexicon_ = label_set_lexicon;
  options_ = options;
}